

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::MultiPartInputFile::MultiPartInputFile
          (MultiPartInputFile *this,IStream *is,int numThreads,bool reconstructChunkOffsetTable)

{
  byte autoAddType;
  byte in_CL;
  int in_EDX;
  ContextInitializer *in_RSI;
  ContextInitializer *in_RDI;
  MultiPartInputFile *unaff_retaddr;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 local_90 [8];
  IStream *in_stack_ffffffffffffff78;
  ContextInitializer *in_stack_ffffffffffffff80;
  ContextInitializer *filename;
  
  autoAddType = in_CL & 1;
  filename = in_RDI;
  IStream::fileName((IStream *)0x137d23);
  memset(local_90,0,0x78);
  ContextInitializer::ContextInitializer((ContextInitializer *)local_90);
  ContextInitializer::silentHeaderParse(in_RDI,(bool)in_stack_ffffffffffffff5f);
  ContextInitializer::strictHeaderValidation(in_RDI,(bool)in_stack_ffffffffffffff5f);
  ContextInitializer::setInputStream(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ContextInitializer::disableChunkReconstruction(in_RDI,(bool)in_stack_ffffffffffffff5f);
  MultiPartInputFile(unaff_retaddr,(char *)filename,in_RSI,in_EDX,(bool)autoAddType);
  return;
}

Assistant:

MultiPartInputFile::MultiPartInputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is,
    int                                      numThreads,
    bool                                     reconstructChunkOffsetTable)
    : MultiPartInputFile (
        is.fileName (),
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false)
        .setInputStream (&is)
        .disableChunkReconstruction(!reconstructChunkOffsetTable),
        numThreads)
{
}